

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.h
# Opt level: O0

TerExpr * __thiscall
SQCompilation::SQParser::
newNode<SQCompilation::TerExpr,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Expr*>
          (SQParser *this,Expr *args,Expr *args_1,Expr *args_2)

{
  Arena *b;
  TerExpr *a;
  SQParser *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  TerExpr *in_stack_ffffffffffffffd0;
  
  b = arena(in_RDI);
  a = (TerExpr *)ArenaObj::operator_new((size_t)b,in_stack_ffffffffffffffb8);
  TerExpr::TerExpr(in_stack_ffffffffffffffd0,(Expr *)a,(Expr *)b,(Expr *)in_stack_ffffffffffffffb8);
  return a;
}

Assistant:

N *newNode(Args... args) {
        return new (arena()) N(args...);
    }